

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall
Json::Path::Path(Path *this,String *path,PathArgument *a1,PathArgument *a2,PathArgument *a3,
                PathArgument *a4,PathArgument *a5)

{
  vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> local_58;
  PathArgument *local_38;
  
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (PathArgument **)0x0;
  local_58.
  super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (PathArgument **)0x0;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::reserve
            (&local_58,5);
  if (local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38 = a1;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_58,
               (iterator)
               local_58.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    *local_58.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a1;
    local_58.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38 = a2;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_58,
               (iterator)
               local_58.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    *local_58.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a2;
    local_58.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38 = a3;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_58,
               (iterator)
               local_58.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    *local_58.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a3;
    local_58.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38 = a4;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_58,
               (iterator)
               local_58.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    *local_58.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a4;
    local_58.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_38 = a5;
  if (local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_58,
               (iterator)
               local_58.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    *local_58.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a5;
    local_58.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  makePath(this,path,&local_58);
  if (local_58.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Path::Path(const String& path, const PathArgument& a1, const PathArgument& a2,
           const PathArgument& a3, const PathArgument& a4,
           const PathArgument& a5) {
  InArgs in;
  in.reserve(5);
  in.push_back(&a1);
  in.push_back(&a2);
  in.push_back(&a3);
  in.push_back(&a4);
  in.push_back(&a5);
  makePath(path, in);
}